

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall yy::mylanguage_parser::error(mylanguage_parser *this,syntax_error *yyexc)

{
  char *pcVar1;
  allocator local_39;
  string local_38 [32];
  syntax_error *local_18;
  syntax_error *yyexc_local;
  mylanguage_parser *this_local;
  
  local_18 = yyexc;
  yyexc_local = (syntax_error *)this;
  pcVar1 = (char *)(**(code **)(*(long *)yyexc + 0x10))();
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,pcVar1,&local_39);
  (*this->_vptr_mylanguage_parser[3])(this,&yyexc->location,local_38);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  return;
}

Assistant:

void
  mylanguage_parser::error (const syntax_error& yyexc)
  {
    error (yyexc.location, yyexc.what ());
  }